

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::chained_buffer::append_buffer<libtorrent::aux::buffer>
          (chained_buffer *this,buffer *buffer,int used_size)

{
  _Elt_pointer pbVar1;
  buffer local_28;
  
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::emplace_back<>(&this->m_vec);
  pbVar1 = (this->m_vec).
           super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 == (this->m_vec).
                super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar1 = (this->m_vec).
             super__Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 8;
  }
  local_28.m_begin = buffer->m_begin;
  local_28.m_size = buffer->m_size;
  buffer->m_begin = (char *)0x0;
  buffer->m_size = 0;
  init_buffer_entry<libtorrent::aux::buffer>(this,pbVar1 + -1,&local_28,used_size);
  free(local_28.m_begin);
  return;
}

Assistant:

void append_buffer(Holder buffer, int used_size)
		{
			TORRENT_ASSERT(is_single_thread());
			TORRENT_ASSERT(int(buffer.size()) >= used_size);
			m_vec.emplace_back();
			buffer_t& b = m_vec.back();
			init_buffer_entry<Holder>(b, std::move(buffer), used_size);
		}